

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall
CEditor::DoQuadEnvelopes
          (CEditor *this,array<CQuad,_allocator_default<CQuad>_> *lQuads,CTextureHandle Texture)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  CPoint CVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  CEnvelope **ppCVar14;
  CEnvPoint *pPoints;
  CQuad *pCVar15;
  void *block;
  int *piVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  CPoint *pCVar23;
  int n;
  int iVar24;
  long in_FS_OFFSET;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float aResults [4];
  int local_b8;
  int iStack_b4;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined8 local_70;
  float local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined8 local_5c;
  float local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  float local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar18 = lQuads->num_elements;
  lVar21 = (long)iVar18;
  uVar20 = 0xffffffffffffffff;
  if (-1 < lVar21) {
    uVar20 = lVar21 * 8;
  }
  block = operator_new__(uVar20);
  mem_zero(block,iVar18 * 8);
  if (0 < lVar21) {
    iVar24 = this->m_ShowEnvelopePreview;
    iVar11 = this->m_SelectedEnvelope;
    iVar12 = (this->m_Map).m_lEnvelopes.num_elements;
    ppCVar14 = (this->m_Map).m_lEnvelopes.list;
    piVar16 = &lQuads->list->m_PosEnv;
    lVar19 = 0;
    do {
      if ((iVar24 == 2) || ((iVar24 == 1 && (*piVar16 == iVar11)))) {
        iVar13 = *piVar16;
        if ((-1 < (long)iVar13) && (iVar13 < iVar12)) {
          *(CEnvelope **)((long)block + lVar19 * 8) = ppCVar14[iVar13];
        }
      }
      lVar19 = lVar19 + 1;
      piVar16 = piVar16 + 0x26;
    } while (lVar21 != lVar19);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])(this->m_pGraphics,0xffffffff);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3ea0a0a1,0x3f169697,0x3f66e6e7,0x3f000000);
  if (0 < iVar18) {
    lVar19 = 0;
    do {
      if ((*(long *)((long)block + lVar19 * 8) != 0) &&
         (piVar16 = *(int **)((long)block + lVar19 * 8), 1 < piVar16[5])) {
        pCVar23 = lQuads->list[lVar19].m_aPoints + 4;
        lVar17 = 0;
        do {
          CRenderTools::RenderEvalEnvelope
                    (*(CEnvPoint **)(piVar16 + 2),piVar16[5],*piVar16,
                     (float)(*(CEnvPoint **)(piVar16 + 2))[lVar17].super_CEnvPoint_v1.m_Time /
                     1000.0 + 1e-06,&local_88);
          CVar5 = *pCVar23;
          iVar24 = 1;
          fVar28 = local_88 + (float)CVar5.x * 0.0009765625;
          fVar27 = fStack_84 + (float)CVar5.y * 0.0009765625;
          do {
            piVar16 = *(int **)((long)block + lVar19 * 8);
            pPoints = *(CEnvPoint **)(piVar16 + 2);
            iVar11 = pPoints[lVar17].super_CEnvPoint_v1.m_Time;
            CRenderTools::RenderEvalEnvelope
                      (pPoints,piVar16[5],*piVar16,
                       (float)(int)((float)(pPoints[lVar17 + 1].super_CEnvPoint_v1.m_Time - iVar11)
                                    * ((float)iVar24 / 15.0) + (float)iVar11) / 1000.0 + -1e-06,
                       &local_88);
            CVar5 = *pCVar23;
            fVar25 = local_88 + (float)CVar5.x * 0.0009765625;
            fVar26 = fStack_84 + (float)CVar5.y * 0.0009765625;
            local_a8 = fVar28;
            fStack_a4 = fVar27;
            fStack_a0 = fVar25;
            fStack_9c = fVar26;
            (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])
                      (this->m_pGraphics,&local_a8,1);
            iVar24 = iVar24 + 1;
            fVar28 = fVar25;
            fVar27 = fVar26;
          } while (iVar24 != 0x10);
          lVar17 = lVar17 + 1;
          piVar16 = *(int **)((long)block + lVar19 * 8);
        } while (lVar17 < (long)piVar16[5] + -1);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar21);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  if (0 < iVar18) {
    lVar19 = 0;
    do {
      if ((*(long *)((long)block + lVar19 * 8) != 0) &&
         (lVar17 = *(long *)((long)block + lVar19 * 8), 0 < *(int *)(lVar17 + 0x14))) {
        pCVar23 = lQuads->list[lVar19].m_aPoints;
        lVar22 = 0x10;
        uVar20 = 0;
        do {
          fVar28 = (((float)*(int *)(*(long *)(lVar17 + 8) + lVar22) * 0.0009765625) / 360.0) *
                   3.1415927;
          pCVar15 = lQuads->list;
          local_78 = 0x3eb33333;
          if (this->m_SelectedQuadEnvelope == pCVar15[lVar19].m_PosEnv) {
            local_78 = *(undefined4 *)
                        (&DAT_001dfd70 + (ulong)(uVar20 == (uint)this->m_SelectedEnvelopePoint) * 4)
            ;
          }
          uVar6 = *(undefined8 *)(*(long *)(lVar17 + 8) + -8 + lVar22);
          local_7c = (float)pCVar15[lVar19].m_aColors[0].b;
          local_88 = 0.0;
          uVar1 = pCVar15[lVar19].m_aColors[0].r;
          uVar7 = pCVar15[lVar19].m_aColors[0].g;
          fStack_84 = (float)(int)uVar1;
          fStack_80 = (float)(int)uVar7;
          local_68 = (float)pCVar15[lVar19].m_aColors[1].b;
          fVar28 = fVar28 + fVar28;
          local_74 = 1;
          uVar2 = pCVar15[lVar19].m_aColors[1].r;
          uVar8 = pCVar15[lVar19].m_aColors[1].g;
          local_70 = CONCAT44((float)(int)uVar8,(float)(int)uVar2);
          local_54 = (float)pCVar15[lVar19].m_aColors[2].b;
          local_60 = 2;
          uVar3 = pCVar15[lVar19].m_aColors[2].r;
          uVar9 = pCVar15[lVar19].m_aColors[2].g;
          local_5c = CONCAT44((float)(int)uVar9,(float)(int)uVar3);
          local_40 = (float)pCVar15[lVar19].m_aColors[3].b;
          local_4c = 3;
          uVar4 = pCVar15[lVar19].m_aColors[3].r;
          uVar10 = pCVar15[lVar19].m_aColors[3].g;
          local_48 = CONCAT44((float)(int)uVar10,(float)(int)uVar4);
          local_64 = local_78;
          local_50 = local_78;
          local_3c = local_78;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])
                    (this->m_pGraphics,&local_88,4);
          if ((fVar28 != 0.0) || (NAN(fVar28))) {
            DoQuadEnvelopes::aRotated[0] = lQuads->list[lVar19].m_aPoints[0];
            DoQuadEnvelopes::aRotated[1] = lQuads->list[lVar19].m_aPoints[1];
            DoQuadEnvelopes::aRotated[2] = lQuads->list[lVar19].m_aPoints[2];
            DoQuadEnvelopes::aRotated[3] = lQuads->list[lVar19].m_aPoints[3];
            pCVar23 = DoQuadEnvelopes::aRotated;
            Rotate(lQuads->list[lVar19].m_aPoints + 4,DoQuadEnvelopes::aRotated,fVar28);
            Rotate(lQuads->list[lVar19].m_aPoints + 4,DoQuadEnvelopes::aRotated + 1,fVar28);
            Rotate(lQuads->list[lVar19].m_aPoints + 4,DoQuadEnvelopes::aRotated + 2,fVar28);
            Rotate(lQuads->list[lVar19].m_aPoints + 4,DoQuadEnvelopes::aRotated + 3,fVar28);
          }
          local_b8 = (int)uVar6;
          iStack_b4 = (int)((ulong)uVar6 >> 0x20);
          pCVar15 = lQuads->list;
          fVar28 = (float)local_b8 * 0.0009765625;
          fVar27 = (float)iStack_b4 * 0.0009765625;
          fVar25 = (float)local_b8 * 0.0009765625;
          fVar26 = (float)iStack_b4 * 0.0009765625;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1b])
                    ((float)pCVar15[lVar19].m_aTexcoords[0].x * 0.0009765625,
                     (float)pCVar15[lVar19].m_aTexcoords[0].y * 0.0009765625,
                     (ulong)(uint)((float)pCVar15[lVar19].m_aTexcoords[1].x * 0.0009765625),
                     (float)pCVar15[lVar19].m_aTexcoords[1].y * 0.0009765625,
                     (float)pCVar15[lVar19].m_aTexcoords[2].x * 0.0009765625,
                     (float)pCVar15[lVar19].m_aTexcoords[2].y * 0.0009765625,
                     (float)pCVar15[lVar19].m_aTexcoords[3].x * 0.0009765625,
                     (float)pCVar15[lVar19].m_aTexcoords[3].y * 0.0009765625,this->m_pGraphics,
                     0xffffffff);
          local_a8 = (float)((CQuad *)pCVar23)->m_aPoints[0].x * 0.0009765625 + fVar28;
          fStack_a4 = (float)((CQuad *)pCVar23)->m_aPoints[0].y * 0.0009765625 + fVar27;
          fStack_a0 = (float)((CQuad *)pCVar23)->m_aPoints[1].x * 0.0009765625 + fVar25;
          fStack_9c = (float)((CQuad *)pCVar23)->m_aPoints[1].y * 0.0009765625 + fVar26;
          local_98 = (float)((CQuad *)pCVar23)->m_aPoints[2].x * 0.0009765625 + fVar28;
          fStack_94 = (float)((CQuad *)pCVar23)->m_aPoints[2].y * 0.0009765625 + fVar27;
          fStack_90 = (float)((CQuad *)pCVar23)->m_aPoints[3].x * 0.0009765625 + fVar25;
          fStack_8c = (float)((CQuad *)pCVar23)->m_aPoints[3].y * 0.0009765625 + fVar26;
          (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1e])
                    (this->m_pGraphics,&local_a8,1);
          uVar20 = uVar20 + 1;
          lVar17 = *(long *)((long)block + lVar19 * 8);
          lVar22 = lVar22 + 0x58;
        } while ((long)uVar20 < (long)*(int *)(lVar17 + 0x14));
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar21);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])(this->m_pGraphics,0xffffffff);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  if (0 < iVar18) {
    lVar19 = 0;
    do {
      if ((*(long *)((long)block + lVar19 * 8) != 0) &&
         (0 < *(int *)(*(long *)((long)block + lVar19 * 8) + 0x14))) {
        iVar18 = 0;
        do {
          DoQuadEnvPoint(this,lQuads->list + lVar19,(int)lVar19,iVar18);
          iVar18 = iVar18 + 1;
        } while (iVar18 < *(int *)(*(long *)((long)block + lVar19 * 8) + 0x14));
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar21);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  operator_delete__(block);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEditor::DoQuadEnvelopes(const array<CQuad> &lQuads, IGraphics::CTextureHandle Texture)
{
	int Num = lQuads.size();
	CEnvelope **apEnvelope = new CEnvelope*[Num];
	mem_zero(apEnvelope, sizeof(CEnvelope*)*Num);
	for(int i = 0; i < Num; i++)
	{
		if((m_ShowEnvelopePreview == SHOWENV_SELECTED && lQuads[i].m_PosEnv == m_SelectedEnvelope) || m_ShowEnvelopePreview == SHOWENV_ALL)
			if(lQuads[i].m_PosEnv >= 0 && lQuads[i].m_PosEnv < m_Map.m_lEnvelopes.size())
				apEnvelope[i] = m_Map.m_lEnvelopes[lQuads[i].m_PosEnv];
	}

	//Draw Lines
	Graphics()->TextureClear();
	Graphics()->LinesBegin();
	Graphics()->SetColor(80.0f/255, 150.0f/255, 230.f/255, 0.5f);
	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		//QuadParams
		const CPoint *pPoints = lQuads[j].m_aPoints;
		for(int i = 0; i < apEnvelope[j]->m_lPoints.size()-1; i++)
		{
			float aResults[4];
			vec2 Pos0 = vec2(0,0);

			apEnvelope[j]->Eval(apEnvelope[j]->m_lPoints[i].m_Time/1000.0f + 0.000001f, aResults);
			Pos0 = vec2(fx2f(pPoints[4].x)+aResults[0], fx2f(pPoints[4].y)+aResults[1]);

			const int Steps = 15;
			for(int n = 1; n <= Steps; n++)
			{
				float a = n/(float)Steps;

				// little offset to prevent looping due to fmod
				float time = mix(apEnvelope[j]->m_lPoints[i].m_Time, apEnvelope[j]->m_lPoints[i+1].m_Time, a);
				apEnvelope[j]->Eval(time/1000.0f - 0.000001f, aResults);

				vec2 Pos1 = vec2(fx2f(pPoints[4].x)+aResults[0], fx2f(pPoints[4].y)+aResults[1]);

				IGraphics::CLineItem Line = IGraphics::CLineItem(Pos0.x, Pos0.y, Pos1.x, Pos1.y);
				Graphics()->LinesDraw(&Line, 1);

				Pos0 = Pos1;
			}
		}
	}
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	Graphics()->LinesEnd();

	//Draw Quads
	Graphics()->TextureSet(Texture);
	Graphics()->QuadsBegin();

	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		//QuadParams
		const CPoint *pPoints = lQuads[j].m_aPoints;

		for(int i = 0; i < apEnvelope[j]->m_lPoints.size(); i++)
		{
			//Calc Env Position
			float OffsetX = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[0]);
			float OffsetY = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[1]);
			float Rot = fx2f(apEnvelope[j]->m_lPoints[i].m_aValues[2])/360.0f*pi*2;

			//Set Colors
			float Alpha = (m_SelectedQuadEnvelope == lQuads[j].m_PosEnv && m_SelectedEnvelopePoint == i) ? 0.65f : 0.35f;
			IGraphics::CColorVertex aArray[4] = {
				IGraphics::CColorVertex(0, lQuads[j].m_aColors[0].r, lQuads[j].m_aColors[0].g, lQuads[j].m_aColors[0].b, Alpha),
				IGraphics::CColorVertex(1, lQuads[j].m_aColors[1].r, lQuads[j].m_aColors[1].g, lQuads[j].m_aColors[1].b, Alpha),
				IGraphics::CColorVertex(2, lQuads[j].m_aColors[2].r, lQuads[j].m_aColors[2].g, lQuads[j].m_aColors[2].b, Alpha),
				IGraphics::CColorVertex(3, lQuads[j].m_aColors[3].r, lQuads[j].m_aColors[3].g, lQuads[j].m_aColors[3].b, Alpha)};
			Graphics()->SetColorVertex(aArray, 4);

			//Rotation
			if(Rot != 0)
			{
				static CPoint aRotated[4];
				aRotated[0] = lQuads[j].m_aPoints[0];
				aRotated[1] = lQuads[j].m_aPoints[1];
				aRotated[2] = lQuads[j].m_aPoints[2];
				aRotated[3] = lQuads[j].m_aPoints[3];
				pPoints = aRotated;

				Rotate(&lQuads[j].m_aPoints[4], &aRotated[0], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[1], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[2], Rot);
				Rotate(&lQuads[j].m_aPoints[4], &aRotated[3], Rot);
			}

			//Set Texture Coords
			Graphics()->QuadsSetSubsetFree(
				fx2f(lQuads[j].m_aTexcoords[0].x), fx2f(lQuads[j].m_aTexcoords[0].y),
				fx2f(lQuads[j].m_aTexcoords[1].x), fx2f(lQuads[j].m_aTexcoords[1].y),
				fx2f(lQuads[j].m_aTexcoords[2].x), fx2f(lQuads[j].m_aTexcoords[2].y),
				fx2f(lQuads[j].m_aTexcoords[3].x), fx2f(lQuads[j].m_aTexcoords[3].y)
			);

			//Set Quad Coords & Draw
			IGraphics::CFreeformItem Freeform(
				fx2f(pPoints[0].x)+OffsetX, fx2f(pPoints[0].y)+OffsetY,
				fx2f(pPoints[1].x)+OffsetX, fx2f(pPoints[1].y)+OffsetY,
				fx2f(pPoints[2].x)+OffsetX, fx2f(pPoints[2].y)+OffsetY,
				fx2f(pPoints[3].x)+OffsetX, fx2f(pPoints[3].y)+OffsetY);
			Graphics()->QuadsDrawFreeform(&Freeform, 1);
		}
	}
	Graphics()->QuadsEnd();
	Graphics()->TextureClear();
	Graphics()->QuadsBegin();

	// Draw QuadPoints
	for(int j = 0; j < Num; j++)
	{
		if(!apEnvelope[j])
			continue;

		for(int i = 0; i < apEnvelope[j]->m_lPoints.size(); i++)
			DoQuadEnvPoint(&lQuads[j], j, i);
	}
	Graphics()->QuadsEnd();
	delete[] apEnvelope;
}